

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::D3MFExporter::writeFaces(D3MFExporter *this,aiMesh *mesh,uint matIdx)

{
  bool bVar1;
  ostream *poVar2;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  aiFace *local_28;
  aiFace *currentFace;
  uint i;
  uint matIdx_local;
  aiMesh *mesh_local;
  D3MFExporter *this_local;
  
  if ((mesh != (aiMesh *)0x0) &&
     (currentFace._4_4_ = matIdx, _i = mesh, mesh_local = (aiMesh *)this,
     bVar1 = aiMesh::HasFaces(mesh), bVar1)) {
    poVar2 = std::operator<<((ostream *)&this->mModelOutput,"<");
    poVar2 = std::operator<<(poVar2,(string *)XmlTag::triangles_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,">");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (currentFace._0_4_ = 0; (uint)currentFace < _i->mNumFaces;
        currentFace._0_4_ = (uint)currentFace + 1) {
      local_28 = _i->mFaces + (uint)currentFace;
      poVar2 = std::operator<<((ostream *)&this->mModelOutput,"<");
      poVar2 = std::operator<<(poVar2,(string *)XmlTag::triangle_abi_cxx11_);
      poVar2 = std::operator<<(poVar2," v1=\"");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_28->mIndices);
      poVar2 = std::operator<<(poVar2,"\" v2=\"");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28->mIndices[1]);
      poVar2 = std::operator<<(poVar2,"\" v3=\"");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28->mIndices[2]);
      to_string<unsigned_int>(&local_88,currentFace._4_4_);
      std::operator+(&local_68,"\" pid=\"1\" p1=\"",&local_88);
      std::operator+(&local_48,&local_68,"\" />");
      std::operator<<(poVar2,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::ostream::operator<<(&this->mModelOutput,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&this->mModelOutput,"</");
    poVar2 = std::operator<<(poVar2,(string *)XmlTag::triangles_abi_cxx11_);
    std::operator<<(poVar2,">");
    std::ostream::operator<<(&this->mModelOutput,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void D3MFExporter::writeFaces( aiMesh *mesh, unsigned int matIdx ) {
    if ( nullptr == mesh ) {
        return;
    }

    if ( !mesh->HasFaces() ) {
        return;
    }
    mModelOutput << "<" << XmlTag::triangles << ">" << std::endl;
    for ( unsigned int i = 0; i < mesh->mNumFaces; ++i ) {
        aiFace &currentFace = mesh->mFaces[ i ];
        mModelOutput << "<" << XmlTag::triangle << " v1=\"" << currentFace.mIndices[ 0 ] << "\" v2=\""
                << currentFace.mIndices[ 1 ] << "\" v3=\"" << currentFace.mIndices[ 2 ]
                << "\" pid=\"1\" p1=\""+to_string(matIdx)+"\" />";
        mModelOutput << std::endl;
    }
    mModelOutput << "</" << XmlTag::triangles << ">";
    mModelOutput << std::endl;
}